

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initiator.cpp
# Opt level: O0

void __thiscall
FIX::Initiator::Initiator
          (Initiator *this,Application *application,MessageStoreFactory *messageStoreFactory,
          SessionSettings *settings)

{
  SessionSettings *settings_local;
  MessageStoreFactory *messageStoreFactory_local;
  Application *application_local;
  Initiator *this_local;
  
  this->_vptr_Initiator = (_func_int **)&PTR__Initiator_0030c258;
  std::
  map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
  ::map(&this->m_sessions);
  std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::set
            (&this->m_sessionIDs);
  std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::set
            (&this->m_pending);
  std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::set
            (&this->m_connected);
  std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::set
            (&this->m_disconnected);
  std::
  map<FIX::SessionID,_int,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_int>_>_>
  ::map(&this->m_sessionState);
  this->m_threadid = 0;
  this->m_application = application;
  this->m_messageStoreFactory = messageStoreFactory;
  SessionSettings::SessionSettings(&this->m_settings,settings);
  this->m_pLogFactory = (LogFactory *)0x0;
  this->m_pLog = (Log *)0x0;
  NullLog::NullLog(&this->m_nullLog);
  this->m_firstPoll = true;
  this->m_stop = true;
  Mutex::Mutex(&this->m_mutex);
  initialize(this);
  return;
}

Assistant:

Initiator::Initiator( Application& application,
                      MessageStoreFactory& messageStoreFactory,
                      const SessionSettings& settings ) EXCEPT ( ConfigError )
: m_threadid( 0 ),
  m_application( application ),
  m_messageStoreFactory( messageStoreFactory ),
  m_settings( settings ),
  m_pLogFactory( 0 ),
  m_pLog( 0 ),
  m_firstPoll( true ),
  m_stop( true )
{ initialize(); }